

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_summon_named(command *cmd)

{
  uint32_t *puVar1;
  loc grid;
  _Bool _Var2;
  wchar_t wVar3;
  monster_race *race;
  int iVar4;
  char *fmt;
  wchar_t r_idx;
  char s [80];
  uint local_8c;
  loc local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  wVar3 = cmd_get_arg_number((command_conflict *)cmd,"index",(int *)&local_8c);
  if (wVar3 == L'\0') {
    if ((0 < (long)(int)local_8c) && (local_8c < z_info->r_max)) {
      race = r_info + (int)local_8c;
      goto LAB_001358d5;
    }
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88.x = L'\0';
    local_88.y = L'\0';
    uStack_80 = 0;
    _Var2 = get_string("Summon which monster? ",(char *)&local_88,0x50);
    if (!_Var2) {
      return;
    }
    _Var2 = get_int_from_string((char *)&local_88,(int *)&local_8c);
    if (_Var2) {
      if ((0 < (long)(int)local_8c) && (local_8c < z_info->r_max)) {
        race = r_info + (int)local_8c;
        goto LAB_001358ba;
      }
    }
    else {
      race = lookup_monster((char *)&local_88);
LAB_001358ba:
      if (race != (monster_race *)0x0) {
        cmd_set_arg_number((command_conflict *)cmd,"index",race->ridx);
        goto LAB_001358d5;
      }
    }
    race = (monster_race *)0x0;
LAB_001358d5:
    if (race != (monster_race *)0x0) {
      iVar4 = 10;
      do {
        grid.x = (player->grid).x;
        grid.y = (player->grid).y;
        wVar3 = scatter_ext(cave,&local_88,L'\x01',grid,L'\x01',true,square_isempty);
        if (wVar3 == L'\0') break;
        _Var2 = place_new_monster((chunk *)cave,(loc_conflict)local_88,race,true,true,
                                  (monster_group_info)0x0,'\x19');
        if (_Var2) {
          puVar1 = &player->upkeep->redraw;
          *puVar1 = *puVar1 | 0x410000;
          return;
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      fmt = "Could not place monster.";
      goto LAB_00135967;
    }
  }
  fmt = "No monster found.";
LAB_00135967:
  msg(fmt);
  return;
}

Assistant:

void do_cmd_wiz_summon_named(struct command *cmd)
{
	int r_idx, i = 0;
	struct monster_race *r = NULL;
	struct monster_group_info info = { 0, 0 };

	if (cmd_get_arg_number(cmd, "index", &r_idx) == CMD_OK) {
		if (r_idx > 0 && r_idx < z_info->r_max) {
			r = &r_info[r_idx];
		}
	} else {
		char s[80] = "";

		if (!get_string("Summon which monster? ", s, sizeof(s))) return;
		/* See if an index was entered */
		if (get_int_from_string(s, &r_idx)) {
			if (r_idx > 0 && r_idx < z_info->r_max) {
				r = &r_info[r_idx];
			}
		} else {
			/* If not, find by name */
			r = lookup_monster(s);
		}
		if (r != NULL) {
			cmd_set_arg_number(cmd, "index", r->ridx);
		}
	}

	if (r == NULL) {
		msg("No monster found.");
		return;
	}

	/* Try 10 times */
	while (1) {
		struct loc grid;

		/* Pick an empty location. */
		if (i >= 10 || scatter_ext(cave, &grid, 1, player->grid, 1,
				true, square_isempty) == 0) {
			msg("Could not place monster.");
			break;
		}

		/* Try to place. */
		if (place_new_monster(cave, grid, r, true, true,
				info, ORIGIN_DROP_WIZARD)) {
			player->upkeep->redraw |= PR_MAP | PR_MONLIST;
			break;
		}

		++i;
	}
}